

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O1

float stb_perlin_noise3_internal
                (float x,float y,float z,int x_wrap,int y_wrap,int z_wrap,uchar seed)

{
  ulong uVar1;
  long lVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  uVar7 = x_wrap - 1U & 0xff;
  uVar5 = y_wrap - 1U & 0xff;
  uVar4 = z_wrap - 1U & 0xff;
  uVar10 = (int)x - (uint)(x < (float)(int)x);
  uVar14 = (int)y - (uint)(y < (float)(int)y);
  uVar12 = (int)z - (uint)(z < (float)(int)z);
  uVar15 = (ulong)(uVar14 & uVar5);
  uVar8 = (ulong)(uVar14 + 1 & uVar5);
  uVar6 = (ulong)(uVar12 & uVar4);
  uVar1 = (ulong)(uVar12 + 1 & uVar4);
  fVar16 = x - (float)(int)uVar10;
  fVar18 = y - (float)(int)uVar14;
  fVar20 = ((fVar18 * 6.0 + -15.0) * fVar18 + 10.0) * fVar18 * fVar18 * fVar18;
  fVar19 = z - (float)(int)uVar12;
  fVar21 = ((fVar19 * 6.0 + -15.0) * fVar19 + 10.0) * fVar19 * fVar19 * fVar19;
  uVar3 = CONCAT71(in_register_00000009,seed) & 0xffffffff;
  lVar2 = (ulong)"\a\t\x05"
                 [uVar6 + stb__perlin_randtab
                          [uVar15 + stb__perlin_randtab[(uVar10 & uVar7) + uVar3]]] * 0x10;
  fVar22 = *(float *)(stb__perlin_grad_basis + lVar2 + 8) * fVar19 +
           *(float *)(stb__perlin_grad_basis + lVar2) * fVar16 +
           *(float *)(stb__perlin_grad_basis + lVar2 + 4) * fVar18;
  fVar23 = fVar19 + -1.0;
  lVar13 = (ulong)"\a\t\x05"
                  [stb__perlin_randtab[uVar15 + stb__perlin_randtab[(uVar10 & uVar7) + uVar3]] +
                   uVar1] * 0x10;
  fVar25 = fVar18 + -1.0;
  lVar2 = (ulong)"\a\t\x05"
                 [uVar6 + stb__perlin_randtab[stb__perlin_randtab[(uVar10 & uVar7) + uVar3] + uVar8]
                 ] * 0x10;
  fVar24 = *(float *)(stb__perlin_grad_basis + lVar2 + 8) * fVar19 +
           *(float *)(stb__perlin_grad_basis + lVar2) * fVar16 +
           *(float *)(stb__perlin_grad_basis + lVar2 + 4) * fVar25;
  lVar11 = (ulong)"\a\t\x05"
                  [stb__perlin_randtab[stb__perlin_randtab[(uVar10 & uVar7) + uVar3] + uVar8] +
                   uVar1] * 0x10;
  fVar17 = fVar16 + -1.0;
  lVar2 = (ulong)"\a\t\x05"
                 [uVar6 + stb__perlin_randtab
                          [uVar15 + stb__perlin_randtab[(uVar10 + 1 & uVar7) + uVar3]]] * 0x10;
  fVar26 = *(float *)(stb__perlin_grad_basis + lVar2 + 8) * fVar19 +
           *(float *)(stb__perlin_grad_basis + lVar2) * fVar17 +
           *(float *)(stb__perlin_grad_basis + lVar2 + 4) * fVar18;
  lVar9 = (ulong)"\a\t\x05"
                 [stb__perlin_randtab[uVar15 + stb__perlin_randtab[(uVar10 + 1 & uVar7) + uVar3]] +
                  uVar1] * 0x10;
  lVar2 = (ulong)"\a\t\x05"
                 [uVar6 + stb__perlin_randtab
                          [uVar8 + stb__perlin_randtab[(uVar10 + 1 & uVar7) + uVar3]]] * 0x10;
  fVar19 = *(float *)(stb__perlin_grad_basis + lVar2) * fVar17 +
           *(float *)(stb__perlin_grad_basis + lVar2 + 4) * fVar25 +
           fVar19 * *(float *)(stb__perlin_grad_basis + lVar2 + 8);
  lVar2 = (ulong)"\a\t\x05"
                 [uVar1 + stb__perlin_randtab
                          [uVar8 + stb__perlin_randtab[(uVar10 + 1 & uVar7) + uVar3]]] * 0x10;
  fVar22 = ((*(float *)(stb__perlin_grad_basis + lVar13 + 8) * fVar23 +
            *(float *)(stb__perlin_grad_basis + lVar13) * fVar16 +
            *(float *)(stb__perlin_grad_basis + lVar13 + 4) * fVar18) - fVar22) * fVar21 + fVar22;
  fVar26 = ((*(float *)(stb__perlin_grad_basis + lVar9 + 8) * fVar23 +
            *(float *)(stb__perlin_grad_basis + lVar9) * fVar17 +
            fVar18 * *(float *)(stb__perlin_grad_basis + lVar9 + 4)) - fVar26) * fVar21 + fVar26;
  fVar22 = ((((*(float *)(stb__perlin_grad_basis + lVar11 + 8) * fVar23 +
              *(float *)(stb__perlin_grad_basis + lVar11) * fVar16 +
              *(float *)(stb__perlin_grad_basis + lVar11 + 4) * fVar25) - fVar24) * fVar21 + fVar24)
           - fVar22) * fVar20 + fVar22;
  return ((((((fVar17 * *(float *)(stb__perlin_grad_basis + lVar2) +
               fVar25 * *(float *)(stb__perlin_grad_basis + lVar2 + 4) +
              fVar23 * *(float *)(stb__perlin_grad_basis + lVar2 + 8)) - fVar19) * fVar21 + fVar19)
           - fVar26) * fVar20 + fVar26) - fVar22) *
         ((fVar16 * 6.0 + -15.0) * fVar16 + 10.0) * fVar16 * fVar16 * fVar16 + fVar22;
}

Assistant:

float stb_perlin_noise3_internal(float x, float y, float z, int x_wrap, int y_wrap, int z_wrap, unsigned char seed)
{
   float u,v,w;
   float n000,n001,n010,n011,n100,n101,n110,n111;
   float n00,n01,n10,n11;
   float n0,n1;

   unsigned int x_mask = (x_wrap-1) & 255;
   unsigned int y_mask = (y_wrap-1) & 255;
   unsigned int z_mask = (z_wrap-1) & 255;
   int px = stb__perlin_fastfloor(x);
   int py = stb__perlin_fastfloor(y);
   int pz = stb__perlin_fastfloor(z);
   int x0 = px & x_mask, x1 = (px+1) & x_mask;
   int y0 = py & y_mask, y1 = (py+1) & y_mask;
   int z0 = pz & z_mask, z1 = (pz+1) & z_mask;
   int r0,r1, r00,r01,r10,r11;

   #define stb__perlin_ease(a)   (((a*6-15)*a + 10) * a * a * a)

   x -= px; u = stb__perlin_ease(x);
   y -= py; v = stb__perlin_ease(y);
   z -= pz; w = stb__perlin_ease(z);

   r0 = stb__perlin_randtab[x0+seed];
   r1 = stb__perlin_randtab[x1+seed];

   r00 = stb__perlin_randtab[r0+y0];
   r01 = stb__perlin_randtab[r0+y1];
   r10 = stb__perlin_randtab[r1+y0];
   r11 = stb__perlin_randtab[r1+y1];

   n000 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z0], x  , y  , z   );
   n001 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r00+z1], x  , y  , z-1 );
   n010 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z0], x  , y-1, z   );
   n011 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r01+z1], x  , y-1, z-1 );
   n100 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z0], x-1, y  , z   );
   n101 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r10+z1], x-1, y  , z-1 );
   n110 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z0], x-1, y-1, z   );
   n111 = stb__perlin_grad(stb__perlin_randtab_grad_idx[r11+z1], x-1, y-1, z-1 );

   n00 = stb__perlin_lerp(n000,n001,w);
   n01 = stb__perlin_lerp(n010,n011,w);
   n10 = stb__perlin_lerp(n100,n101,w);
   n11 = stb__perlin_lerp(n110,n111,w);

   n0 = stb__perlin_lerp(n00,n01,v);
   n1 = stb__perlin_lerp(n10,n11,v);

   return stb__perlin_lerp(n0,n1,u);
}